

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

void TestRoundTrip(char *fn)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  initializer_list<float> v_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_01;
  span<const_float> values;
  WrapMode2D wrapMode;
  Point2i p;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  bool bVar1;
  int *piVar2;
  reference pvVar3;
  Message *pMVar4;
  char *pcVar5;
  allocator<char> *this;
  float fVar6;
  Float FVar7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  float delta;
  float wrote;
  int c;
  ImageChannelValues rgb;
  int x_1;
  int y_1;
  AssertionResult gtest_ar__1;
  ImageChannelDesc rgbDesc;
  AssertionResult gtest_ar;
  ImageAndMetadata readImage;
  AssertionResult gtest_ar_;
  string filename;
  int x;
  int y;
  Image image;
  Point2i res;
  nullptr_t in_stack_fffffffffffff2c8;
  string *path;
  ImageAndMetadata *in_stack_fffffffffffff2d0;
  undefined4 in_stack_fffffffffffff2d8;
  WrapMode in_stack_fffffffffffff2dc;
  Message *in_stack_fffffffffffff2e0;
  Message *in_stack_fffffffffffff2e8;
  int iVar8;
  Message *in_stack_fffffffffffff2f0;
  reference in_stack_fffffffffffff2f8;
  Type type;
  allocator<char> *in_stack_fffffffffffff300;
  Message *in_stack_fffffffffffff308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff310;
  Image *in_stack_fffffffffffff320;
  float *in_stack_fffffffffffff328;
  char *in_stack_fffffffffffff330;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff338;
  Message *in_stack_fffffffffffff340;
  Image *in_stack_fffffffffffff348;
  undefined4 in_stack_fffffffffffff350;
  WrapMode in_stack_fffffffffffff354;
  WrapMode in_stack_fffffffffffff358;
  int in_stack_fffffffffffff35c;
  int in_stack_fffffffffffff360;
  Message *in_stack_fffffffffffff380;
  Message *in_stack_fffffffffffff388;
  Message *in_stack_fffffffffffff390;
  Message *in_stack_fffffffffffff398;
  string *in_stack_fffffffffffff3a0;
  Image *in_stack_fffffffffffff3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3b0;
  size_t in_stack_fffffffffffff3b8;
  ColorEncodingHandle *in_stack_fffffffffffff3e0;
  undefined8 in_stack_fffffffffffff3e8;
  PixelFormat format;
  Image *in_stack_fffffffffffff3f0;
  Allocator in_stack_fffffffffffff3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff400;
  size_t in_stack_fffffffffffff408;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff410;
  ImageChannelDesc *in_stack_fffffffffffff420;
  Image *in_stack_fffffffffffff428;
  array<pbrt::WrapMode,_2> in_stack_fffffffffffff430;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff438;
  string *local_a40;
  string *local_8f0;
  AssertionResult local_8a0 [2];
  undefined8 local_880;
  float local_874;
  AssertionResult local_870 [2];
  undefined4 local_84c;
  AssertionResult local_848 [2];
  undefined8 local_828;
  float local_81c;
  AssertionResult local_818 [2];
  undefined4 local_7f4;
  AssertionResult local_7f0;
  allocator<char> local_7d9;
  string local_7d8 [52];
  undefined4 local_7a4;
  AssertionResult local_7a0;
  allocator<char> local_789;
  string local_788 [36];
  float local_764;
  Float local_750;
  int local_74c;
  int local_708;
  int local_704;
  string local_700 [48];
  AssertionResult local_6d0;
  undefined1 local_6bc;
  allocator<char> local_6bb;
  allocator<char> local_6ba;
  allocator<char> local_6b9;
  string *local_6b8;
  string local_6b0 [32];
  undefined1 local_690 [32];
  undefined1 local_670 [32];
  string *local_650;
  undefined8 local_648;
  Tuple2<pbrt::Point2,_int> local_5f0;
  AssertionResult local_5e8 [17];
  ImageMetadata *in_stack_fffffffffffffb30;
  string *in_stack_fffffffffffffb38;
  Image *in_stack_fffffffffffffb40;
  string local_3a8 [48];
  optional<float> local_378;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_370;
  undefined4 local_330;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_32c;
  undefined4 local_2ec;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_2e8;
  undefined4 local_2d8;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_2d4;
  undefined4 local_2cc;
  optional<int> local_2c8;
  optional<float> local_2c0;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  ColorEncodingHandle *encoding;
  string *name;
  Allocator alloc;
  AssertionResult local_278;
  allocator<char> local_261;
  string local_260 [32];
  string local_240 [36];
  float local_21c;
  float local_218;
  undefined4 local_214;
  float *local_210;
  undefined8 local_208;
  int local_1e8;
  int local_1e4;
  string *local_1e0;
  undefined1 local_1cf;
  allocator<char> local_1ce;
  allocator<char> local_1cd [20];
  allocator<char> local_1b9;
  string *local_1b8;
  string local_1b0 [32];
  undefined1 local_190 [32];
  undefined1 local_170 [32];
  string *local_150;
  undefined8 local_148;
  Tuple2<pbrt::Point2,_int> local_130;
  Tuple2<pbrt::Point2,_int> local_10 [2];
  
  format = (PixelFormat)((ulong)in_stack_fffffffffffff3e8 >> 0x20);
  pbrt::Point2<int>::Point2
            ((Point2<int> *)in_stack_fffffffffffff2d0,
             (int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),(int)in_stack_fffffffffffff2c8);
  local_130 = local_10[0];
  local_1cf = 1;
  local_1b8 = local_1b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff310,(char *)in_stack_fffffffffffff308,in_stack_fffffffffffff300);
  local_1b8 = (string *)local_190;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff310,(char *)in_stack_fffffffffffff308,in_stack_fffffffffffff300);
  local_1b8 = (string *)local_170;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff310,(char *)in_stack_fffffffffffff308,in_stack_fffffffffffff300);
  local_1cf = 0;
  local_150 = local_1b0;
  local_148 = 3;
  v._M_array._4_4_ = in_stack_fffffffffffff2dc;
  v._M_array._0_4_ = in_stack_fffffffffffff2d8;
  v._M_len = (size_type)in_stack_fffffffffffff2e0;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff2d0,v);
  pbrt::ColorEncodingHandle::TaggedPointer
            ((ColorEncodingHandle *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff2d0);
  channels.n = in_stack_fffffffffffff408;
  channels.ptr = in_stack_fffffffffffff400;
  pbrt::Image::Image(in_stack_fffffffffffff3f0,format,(Point2i)in_stack_fffffffffffff410,channels,
                     in_stack_fffffffffffff3e0,in_stack_fffffffffffff3f8);
  local_8f0 = (string *)&local_150;
  path = local_1e0;
  do {
    local_8f0 = local_8f0 + -0x20;
    std::__cxx11::string::~string(local_8f0);
  } while (local_8f0 != local_1b0);
  std::allocator<char>::~allocator(&local_1ce);
  std::allocator<char>::~allocator(local_1cd);
  std::allocator<char>::~allocator(&local_1b9);
  for (local_1e4 = 0; iVar8 = local_1e4,
      piVar2 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,1), iVar8 < *piVar2;
      local_1e4 = local_1e4 + 1) {
    for (local_1e8 = 0; iVar8 = local_1e8,
        piVar2 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0), iVar8 < *piVar2;
        local_1e8 = local_1e8 + 1) {
      pbrt::Point2<int>::Point2
                ((Point2<int> *)in_stack_fffffffffffff2d0,(int)((ulong)path >> 0x20),(int)path);
      fVar6 = (float)local_1e8;
      piVar2 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0);
      local_21c = fVar6 / (float)(*piVar2 + -1);
      fVar6 = (float)local_1e4;
      piVar2 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,1);
      local_218 = fVar6 / (float)(*piVar2 + -1);
      local_214 = 0xbfc00000;
      local_210 = &local_21c;
      local_208 = 3;
      v_00._M_array._4_4_ = in_stack_fffffffffffff2dc;
      v_00._M_array._0_4_ = in_stack_fffffffffffff2d8;
      v_00._M_len = (size_type)in_stack_fffffffffffff2e0;
      pstd::span<const_float>::span((span<const_float> *)in_stack_fffffffffffff2d0,v_00);
      values.n = (size_t)in_stack_fffffffffffff330;
      values.ptr = in_stack_fffffffffffff328;
      pbrt::Image::SetChannels(in_stack_fffffffffffff320,(Point2i)in_stack_fffffffffffff338,values);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff310,(char *)in_stack_fffffffffffff308,in_stack_fffffffffffff300);
  inTestDir(path);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  local_378.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_378.set = false;
  local_378._5_3_ = 0;
  pstd::optional<float>::optional(&local_378);
  local_370 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
              vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_330 = 0;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&local_370.__align);
  local_32c = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
              vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_2ec = 0;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&local_32c.__align);
  local_2e8 = (aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)>)0x0;
  local_2d8 = 0;
  pstd::optional<pbrt::Bounds2<int>_>::optional((optional<pbrt::Bounds2<int>_> *)&local_2e8.__align)
  ;
  local_2cc = 0;
  local_2d4 = (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>)0x0;
  pstd::optional<pbrt::Point2<int>_>::optional((optional<pbrt::Point2<int>_> *)&local_2d4.__align);
  local_2c8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  local_2c8.set = false;
  local_2c8._5_3_ = 0;
  pstd::optional<int>::optional(&local_2c8);
  local_2c0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_2c0.set = false;
  local_2c0._5_3_ = 0;
  pstd::optional<float>::optional(&local_2c0);
  local_2b8 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
               )0x0;
  uStack_2b0 = 0;
  pstd::optional<const_pbrt::RGBColorSpace_*>::optional
            ((optional<const_pbrt::RGBColorSpace_*> *)&local_2b8.__align);
  alloc.memoryResource = (memory_resource *)0x0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  encoding = (ColorEncodingHandle *)0x0;
  name = (string *)0x0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0x5d1629);
  pbrt::Image::Write(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffff2d0,SUB81((ulong)path >> 0x38,0));
  pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)in_stack_fffffffffffff2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_278);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff300);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff348,(char *)in_stack_fffffffffffff340,
               (char *)in_stack_fffffffffffff338,in_stack_fffffffffffff330);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff300,
               (Type)((ulong)in_stack_fffffffffffff2f8 >> 0x20),(char *)in_stack_fffffffffffff2f0,
               (int)((ulong)in_stack_fffffffffffff2e8 >> 0x20),(char *)in_stack_fffffffffffff2e0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
               (Message *)in_stack_fffffffffffff348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff2d0);
    std::__cxx11::string::~string(local_3a8);
    testing::Message::~Message((Message *)0x5d17a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d1855);
  if (bVar1) {
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff2d0);
    pbrt::ColorEncodingHandle::TaggedPointer((ColorEncodingHandle *)in_stack_fffffffffffff2d0,path);
    pbrt::Image::Read(name,alloc,encoding);
    local_5f0 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution((Image *)(local_5e8 + 2));
    testing::internal::EqHelper<false>::Compare<pbrt::Point2<int>,pbrt::Point2<int>>
              ((char *)in_stack_fffffffffffff2e8,(char *)in_stack_fffffffffffff2e0,
               (Point2<int> *)CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
               (Point2<int> *)in_stack_fffffffffffff2d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5e8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff300);
      testing::AssertionResult::failure_message((AssertionResult *)0x5d1967);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff300,
                 (Type)((ulong)in_stack_fffffffffffff2f8 >> 0x20),(char *)in_stack_fffffffffffff2f0,
                 (int)((ulong)in_stack_fffffffffffff2e8 >> 0x20),(char *)in_stack_fffffffffffff2e0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
                 (Message *)in_stack_fffffffffffff348);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff2d0);
      testing::Message::~Message((Message *)0x5d19ca);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d1a51);
    if (bVar1) {
      local_6bc = 1;
      local_6b8 = local_6b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff310,(char *)in_stack_fffffffffffff308,
                 in_stack_fffffffffffff300);
      local_6b8 = (string *)local_690;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff310,(char *)in_stack_fffffffffffff308,
                 in_stack_fffffffffffff300);
      local_6b8 = (string *)local_670;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff310,(char *)in_stack_fffffffffffff308,
                 in_stack_fffffffffffff300);
      local_6bc = 0;
      local_650 = local_6b0;
      local_648 = 3;
      v_01._M_array._4_4_ = in_stack_fffffffffffff2dc;
      v_01._M_array._0_4_ = in_stack_fffffffffffff2d8;
      v_01._M_len = (size_type)in_stack_fffffffffffff2e0;
      pstd::
      span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_stack_fffffffffffff2d0,v_01);
      requestedChannels.n = in_stack_fffffffffffff3b8;
      requestedChannels.ptr = in_stack_fffffffffffff3b0;
      pbrt::Image::GetChannelDesc(in_stack_fffffffffffff3a8,requestedChannels);
      local_a40 = (string *)&local_650;
      do {
        local_a40 = local_a40 + -0x20;
        std::__cxx11::string::~string(local_a40);
      } while (local_a40 != local_6b0);
      std::allocator<char>::~allocator(&local_6bb);
      std::allocator<char>::~allocator(&local_6ba);
      std::allocator<char>::~allocator(&local_6b9);
      pbrt::ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x5d1c4b);
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)in_stack_fffffffffffff2d0,SUB81((ulong)path >> 0x38,0));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6d0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffff300);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)in_stack_fffffffffffff348,(char *)in_stack_fffffffffffff340,
                   (char *)in_stack_fffffffffffff338,in_stack_fffffffffffff330);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffff300,
                   (Type)((ulong)in_stack_fffffffffffff2f8 >> 0x20),
                   (char *)in_stack_fffffffffffff2f0,(int)((ulong)in_stack_fffffffffffff2e8 >> 0x20)
                   ,(char *)in_stack_fffffffffffff2e0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
                   (Message *)in_stack_fffffffffffff348);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff2d0);
        std::__cxx11::string::~string(local_700);
        testing::Message::~Message((Message *)0x5d1e9c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d1f49);
      if (bVar1) {
        local_704 = 0;
        while( true ) {
          iVar8 = local_704;
          piVar2 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,1);
          type = (Type)((ulong)in_stack_fffffffffffff2f8 >> 0x20);
          if (*piVar2 <= iVar8) break;
          for (local_708 = 0; iVar8 = local_708,
              piVar2 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0), iVar8 < *piVar2;
              local_708 = local_708 + 1) {
            pbrt::Point2<int>::Point2
                      ((Point2<int> *)in_stack_fffffffffffff2d0,(int)((ulong)path >> 0x20),(int)path
                      );
            pbrt::WrapMode2D::WrapMode2D
                      ((WrapMode2D *)in_stack_fffffffffffff2e0,in_stack_fffffffffffff2dc);
            pbrt::Image::GetChannels
                      (in_stack_fffffffffffff428,(Point2i)in_stack_fffffffffffff438,
                       in_stack_fffffffffffff420,(WrapMode2D)in_stack_fffffffffffff430.values);
            for (local_74c = 0; local_74c < 3; local_74c = local_74c + 1) {
              pbrt::Point2<int>::Point2
                        ((Point2<int> *)in_stack_fffffffffffff2d0,(int)((ulong)path >> 0x20),
                         (int)path);
              pbrt::WrapMode2D::WrapMode2D
                        ((WrapMode2D *)in_stack_fffffffffffff2e0,in_stack_fffffffffffff2dc);
              p.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff360;
              p.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff35c;
              wrapMode.wrap.values[1] = in_stack_fffffffffffff358;
              wrapMode.wrap.values[0] = in_stack_fffffffffffff354;
              FVar7 = pbrt::Image::GetChannel
                                (in_stack_fffffffffffff348,p,
                                 (int)((ulong)in_stack_fffffffffffff340 >> 0x20),wrapMode);
              local_750 = FVar7;
              pvVar3 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                       operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   *)in_stack_fffffffffffff2d0,(size_type)path);
              local_764 = FVar7 - *pvVar3;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff310,(char *)in_stack_fffffffffffff308,
                         in_stack_fffffffffffff300);
              bVar1 = pbrt::HasExtension((string *)in_stack_fffffffffffff3a8,
                                         in_stack_fffffffffffff3a0);
              std::__cxx11::string::~string(local_788);
              std::allocator<char>::~allocator(&local_789);
              if (bVar1) {
                local_7a4 = 0;
                testing::internal::EqHelper<true>::Compare<int,float>
                          ((char *)in_stack_fffffffffffff2e8,(char *)in_stack_fffffffffffff2e0,
                           (int *)CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                           (float *)in_stack_fffffffffffff2d0,path);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7a0);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffff300);
                  testing::Message::operator<<((Message *)in_stack_fffffffffffff2d0,path);
                  testing::Message::operator<<
                            ((Message *)in_stack_fffffffffffff2d0,(char (*) [3])path);
                  testing::Message::operator<<((Message *)in_stack_fffffffffffff2d0,(int *)path);
                  testing::Message::operator<<
                            ((Message *)in_stack_fffffffffffff2d0,(char (*) [3])path);
                  testing::Message::operator<<((Message *)in_stack_fffffffffffff2d0,(int *)path);
                  testing::Message::operator<<
                            ((Message *)in_stack_fffffffffffff2d0,(char (*) [7])path);
                  testing::Message::operator<<((Message *)in_stack_fffffffffffff2d0,(int *)path);
                  testing::Message::operator<<
                            ((Message *)in_stack_fffffffffffff2d0,(char (*) [8])path);
                  testing::Message::operator<<((Message *)in_stack_fffffffffffff2d0,(float *)path);
                  testing::Message::operator<<
                            ((Message *)in_stack_fffffffffffff2d0,(char (*) [8])path);
                  pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                  operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                             in_stack_fffffffffffff2d0,(size_type)path);
                  testing::Message::operator<<((Message *)in_stack_fffffffffffff2d0,(float *)path);
                  testing::Message::operator<<
                            ((Message *)in_stack_fffffffffffff2d0,(char (*) [11])path);
                  testing::Message::operator<<((Message *)in_stack_fffffffffffff2d0,(float *)path);
                  testing::AssertionResult::failure_message((AssertionResult *)0x5d2457);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffff300,
                             (Type)((ulong)in_stack_fffffffffffff2f8 >> 0x20),
                             (char *)in_stack_fffffffffffff2f0,
                             (int)((ulong)in_stack_fffffffffffff2e8 >> 0x20),
                             (char *)in_stack_fffffffffffff2e0);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)
                             CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
                             (Message *)in_stack_fffffffffffff348);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffff2d0);
                  testing::Message::~Message((Message *)0x5d24ba);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d2525);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff310,(char *)in_stack_fffffffffffff308,
                           in_stack_fffffffffffff300);
                bVar1 = pbrt::HasExtension((string *)in_stack_fffffffffffff3a8,
                                           in_stack_fffffffffffff3a0);
                std::__cxx11::string::~string(local_7d8);
                this = &local_7d9;
                std::allocator<char>::~allocator(this);
                if (bVar1) {
                  if (local_74c == 2) {
                    local_7f4 = 0;
                    testing::internal::EqHelper<true>::Compare<int,float>
                              ((char *)in_stack_fffffffffffff2e8,(char *)in_stack_fffffffffffff2e0,
                               (int *)CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                               (float *)in_stack_fffffffffffff2d0,path);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7f0);
                    if (!bVar1) {
                      testing::Message::Message((Message *)in_stack_fffffffffffff300);
                      testing::Message::operator<<
                                ((Message *)in_stack_fffffffffffff2d0,(char (*) [2])path);
                      testing::Message::operator<<((Message *)in_stack_fffffffffffff2d0,(int *)path)
                      ;
                      testing::Message::operator<<
                                ((Message *)in_stack_fffffffffffff2d0,(char (*) [3])path);
                      testing::Message::operator<<((Message *)in_stack_fffffffffffff2d0,(int *)path)
                      ;
                      testing::Message::operator<<
                                ((Message *)in_stack_fffffffffffff2d0,(char (*) [7])path);
                      testing::Message::operator<<((Message *)in_stack_fffffffffffff2d0,(int *)path)
                      ;
                      testing::Message::operator<<
                                ((Message *)in_stack_fffffffffffff2d0,(char (*) [8])path);
                      testing::Message::operator<<
                                ((Message *)in_stack_fffffffffffff2d0,(float *)path);
                      testing::Message::operator<<
                                ((Message *)in_stack_fffffffffffff2d0,(char (*) [8])path);
                      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                      operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  *)in_stack_fffffffffffff2d0,(size_type)path);
                      testing::Message::operator<<
                                ((Message *)in_stack_fffffffffffff2d0,(float *)path);
                      testing::Message::operator<<
                                ((Message *)in_stack_fffffffffffff2d0,(char (*) [11])path);
                      testing::Message::operator<<
                                ((Message *)in_stack_fffffffffffff2d0,(float *)path);
                      in_stack_fffffffffffff438 =
                           (Tuple2<pbrt::Point2,_int>)
                           testing::AssertionResult::failure_message((AssertionResult *)0x5d280c);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)in_stack_fffffffffffff300,
                                 (Type)((ulong)in_stack_fffffffffffff2f8 >> 0x20),
                                 (char *)in_stack_fffffffffffff2f0,
                                 (int)((ulong)in_stack_fffffffffffff2e8 >> 0x20),
                                 (char *)in_stack_fffffffffffff2e0);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)
                                 CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
                                 (Message *)in_stack_fffffffffffff348);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)in_stack_fffffffffffff2d0);
                      testing::Message::~Message((Message *)0x5d286f);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d28da);
                  }
                  else {
                    fVar6 = local_764;
                    std::abs((int)this);
                    local_828 = 0x3f50624dd2f1a9fc;
                    local_81c = fVar6;
                    testing::internal::CmpHelperLT<float,double>
                              ((char *)in_stack_fffffffffffff398,(char *)in_stack_fffffffffffff390,
                               (float *)in_stack_fffffffffffff388,
                               (double *)in_stack_fffffffffffff380);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_818);
                    if (!bVar1) {
                      testing::Message::Message((Message *)in_stack_fffffffffffff300);
                      in_stack_fffffffffffff430.values =
                           (WrapMode  [2])
                           testing::Message::operator<<((Message *)in_stack_fffffffffffff2d0,path);
                      in_stack_fffffffffffff428 =
                           (Image *)testing::Message::operator<<
                                              ((Message *)in_stack_fffffffffffff2d0,
                                               (char (*) [3])path);
                      in_stack_fffffffffffff420 =
                           (ImageChannelDesc *)
                           testing::Message::operator<<
                                     ((Message *)in_stack_fffffffffffff2d0,(int *)path);
                      testing::Message::operator<<
                                ((Message *)in_stack_fffffffffffff2d0,(char (*) [3])path);
                      testing::Message::operator<<((Message *)in_stack_fffffffffffff2d0,(int *)path)
                      ;
                      testing::Message::operator<<
                                ((Message *)in_stack_fffffffffffff2d0,(char (*) [7])path);
                      testing::Message::operator<<((Message *)in_stack_fffffffffffff2d0,(int *)path)
                      ;
                      testing::Message::operator<<
                                ((Message *)in_stack_fffffffffffff2d0,(char (*) [8])path);
                      testing::Message::operator<<
                                ((Message *)in_stack_fffffffffffff2d0,(float *)path);
                      testing::Message::operator<<
                                ((Message *)in_stack_fffffffffffff2d0,(char (*) [8])path);
                      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                      operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  *)in_stack_fffffffffffff2d0,(size_type)path);
                      testing::Message::operator<<
                                ((Message *)in_stack_fffffffffffff2d0,(float *)path);
                      testing::Message::operator<<
                                ((Message *)in_stack_fffffffffffff2d0,(char (*) [11])path);
                      testing::Message::operator<<
                                ((Message *)in_stack_fffffffffffff2d0,(float *)path);
                      testing::AssertionResult::failure_message((AssertionResult *)0x5d2b27);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)in_stack_fffffffffffff300,
                                 (Type)((ulong)in_stack_fffffffffffff2f8 >> 0x20),
                                 (char *)in_stack_fffffffffffff2f0,
                                 (int)((ulong)in_stack_fffffffffffff2e8 >> 0x20),
                                 (char *)in_stack_fffffffffffff2e0);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)
                                 CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
                                 (Message *)in_stack_fffffffffffff348);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)in_stack_fffffffffffff2d0);
                      testing::Message::~Message((Message *)0x5d2b8a);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d2bf5);
                  }
                }
                else if (local_74c == 2) {
                  local_84c = 0;
                  pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                  operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                             in_stack_fffffffffffff2d0,(size_type)path);
                  testing::internal::EqHelper<true>::Compare<int,float>
                            ((char *)in_stack_fffffffffffff2e8,(char *)in_stack_fffffffffffff2e0,
                             (int *)CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                             (float *)in_stack_fffffffffffff2d0,path);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_848);
                  if (!bVar1) {
                    testing::Message::Message((Message *)in_stack_fffffffffffff300);
                    testing::Message::operator<<
                              ((Message *)in_stack_fffffffffffff2d0,(char (*) [2])path);
                    in_stack_fffffffffffff3a8 =
                         (Image *)testing::Message::operator<<
                                            ((Message *)in_stack_fffffffffffff2d0,(int *)path);
                    in_stack_fffffffffffff3a0 =
                         (string *)
                         testing::Message::operator<<
                                   ((Message *)in_stack_fffffffffffff2d0,(char (*) [3])path);
                    in_stack_fffffffffffff398 =
                         testing::Message::operator<<
                                   ((Message *)in_stack_fffffffffffff2d0,(int *)path);
                    in_stack_fffffffffffff390 =
                         testing::Message::operator<<
                                   ((Message *)in_stack_fffffffffffff2d0,(char (*) [7])path);
                    in_stack_fffffffffffff388 =
                         testing::Message::operator<<
                                   ((Message *)in_stack_fffffffffffff2d0,(int *)path);
                    in_stack_fffffffffffff380 =
                         testing::Message::operator<<
                                   ((Message *)in_stack_fffffffffffff2d0,(char (*) [8])path);
                    testing::Message::operator<<((Message *)in_stack_fffffffffffff2d0,(float *)path)
                    ;
                    testing::Message::operator<<
                              ((Message *)in_stack_fffffffffffff2d0,(char (*) [8])path);
                    pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                    operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                               in_stack_fffffffffffff2d0,(size_type)path);
                    pMVar4 = testing::Message::operator<<
                                       ((Message *)in_stack_fffffffffffff2d0,(float *)path);
                    in_stack_fffffffffffff360 = (int)pMVar4;
                    pMVar4 = testing::Message::operator<<
                                       ((Message *)in_stack_fffffffffffff2d0,(char (*) [19])path);
                    in_stack_fffffffffffff358 = (WrapMode)pMVar4;
                    in_stack_fffffffffffff35c = (int)((ulong)pMVar4 >> 0x20);
                    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x5d2e1a);
                    in_stack_fffffffffffff350 = SUB84(pcVar5,0);
                    in_stack_fffffffffffff354 = (WrapMode)((ulong)pcVar5 >> 0x20);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)in_stack_fffffffffffff300,
                               (Type)((ulong)in_stack_fffffffffffff2f8 >> 0x20),
                               (char *)in_stack_fffffffffffff2f0,
                               (int)((ulong)in_stack_fffffffffffff2e8 >> 0x20),
                               (char *)in_stack_fffffffffffff2e0);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)
                               CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
                               (Message *)in_stack_fffffffffffff348);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)in_stack_fffffffffffff2d0);
                    testing::Message::~Message((Message *)0x5d2e7d);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d2ee8);
                }
                else {
                  fVar6 = local_764;
                  std::abs((int)this);
                  local_880 = 0x3f947ae147ae147b;
                  local_874 = fVar6;
                  testing::internal::CmpHelperLT<float,double>
                            ((char *)in_stack_fffffffffffff398,(char *)in_stack_fffffffffffff390,
                             (float *)in_stack_fffffffffffff388,(double *)in_stack_fffffffffffff380)
                  ;
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_870);
                  if (!bVar1) {
                    testing::Message::Message((Message *)in_stack_fffffffffffff300);
                    in_stack_fffffffffffff348 =
                         (Image *)testing::Message::operator<<
                                            ((Message *)in_stack_fffffffffffff2d0,path);
                    in_stack_fffffffffffff340 =
                         testing::Message::operator<<
                                   ((Message *)in_stack_fffffffffffff2d0,(char (*) [3])path);
                    testing::Message::operator<<((Message *)in_stack_fffffffffffff2d0,(int *)path);
                    testing::Message::operator<<
                              ((Message *)in_stack_fffffffffffff2d0,(char (*) [3])path);
                    testing::Message::operator<<((Message *)in_stack_fffffffffffff2d0,(int *)path);
                    testing::Message::operator<<
                              ((Message *)in_stack_fffffffffffff2d0,(char (*) [7])path);
                    testing::Message::operator<<((Message *)in_stack_fffffffffffff2d0,(int *)path);
                    in_stack_fffffffffffff310 =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         testing::Message::operator<<
                                   ((Message *)in_stack_fffffffffffff2d0,(char (*) [8])path);
                    in_stack_fffffffffffff308 =
                         testing::Message::operator<<
                                   ((Message *)in_stack_fffffffffffff2d0,(float *)path);
                    in_stack_fffffffffffff300 =
                         (allocator<char> *)
                         testing::Message::operator<<
                                   ((Message *)in_stack_fffffffffffff2d0,(char (*) [8])path);
                    in_stack_fffffffffffff2f8 =
                         pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                         operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)in_stack_fffffffffffff2d0,(size_type)path);
                    in_stack_fffffffffffff2f0 =
                         testing::Message::operator<<
                                   ((Message *)in_stack_fffffffffffff2d0,(float *)path);
                    in_stack_fffffffffffff2e8 =
                         testing::Message::operator<<
                                   ((Message *)in_stack_fffffffffffff2d0,(char (*) [11])path);
                    in_stack_fffffffffffff2e0 =
                         testing::Message::operator<<
                                   ((Message *)in_stack_fffffffffffff2d0,(float *)path);
                    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x5d30ea);
                    in_stack_fffffffffffff2d8 = SUB84(pcVar5,0);
                    in_stack_fffffffffffff2dc = (WrapMode)((ulong)pcVar5 >> 0x20);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)in_stack_fffffffffffff300,
                               (Type)((ulong)in_stack_fffffffffffff2f8 >> 0x20),
                               (char *)in_stack_fffffffffffff2f0,
                               (int)((ulong)in_stack_fffffffffffff2e8 >> 0x20),
                               (char *)in_stack_fffffffffffff2e0);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)
                               CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
                               (Message *)in_stack_fffffffffffff348);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)in_stack_fffffffffffff2d0);
                    testing::Message::~Message((Message *)0x5d3144);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d31af);
                }
              }
            }
            pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x5d31e9);
          }
          local_704 = local_704 + 1;
        }
        pcVar5 = (char *)std::__cxx11::string::c_str();
        remove(pcVar5);
        testing::internal::EqHelper<true>::Compare<int,int>
                  ((char *)in_stack_fffffffffffff2e8,(char *)in_stack_fffffffffffff2e0,
                   (int *)CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                   (int *)in_stack_fffffffffffff2d0,path);
        iVar8 = (int)((ulong)in_stack_fffffffffffff2e8 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8a0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffff300);
          in_stack_fffffffffffff2d0 =
               (ImageAndMetadata *)
               testing::AssertionResult::failure_message((AssertionResult *)0x5d32b6);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffff300,type,
                     (char *)in_stack_fffffffffffff2f0,iVar8,(char *)in_stack_fffffffffffff2e0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
                     (Message *)in_stack_fffffffffffff348);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff2d0);
          testing::Message::~Message((Message *)0x5d3313);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d3381);
      }
      pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x5d3399);
    }
    pbrt::ImageAndMetadata::~ImageAndMetadata(in_stack_fffffffffffff2d0);
  }
  std::__cxx11::string::~string(local_240);
  pbrt::Image::~Image(&in_stack_fffffffffffff2d0->image);
  return;
}

Assistant:

static void TestRoundTrip(const char *fn) {
    Point2i res(16, 29);
    Image image(PixelFormat::Float, res, {"R", "G", "B"});
    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x)
            image.SetChannels({x, y}, {Float(x) / Float(res[0] - 1),
                                       Float(y) / Float(res[1] - 1), Float(-1.5)});

    std::string filename = inTestDir(fn);
    ASSERT_TRUE(image.Write(filename));

    ImageAndMetadata readImage = Image::Read(filename);
    ASSERT_EQ(readImage.image.Resolution(), res);

    ImageChannelDesc rgbDesc = readImage.image.GetChannelDesc({"R", "G", "B"});
    ASSERT_TRUE((bool)rgbDesc);

    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x) {
            ImageChannelValues rgb = readImage.image.GetChannels({x, y}, rgbDesc);

            for (int c = 0; c < 3; ++c) {
                float wrote = image.GetChannel({x, y}, c);
                float delta = wrote - rgb[c];
                if (HasExtension(filename, "pfm")) {
                    // Everything should come out exact.
                    EXPECT_EQ(0, delta) << filename << ":(" << x << ", " << y
                                        << ") c = " << c << " wrote " << wrote
                                        << ", read " << rgb[c] << ", delta = " << delta;
                } else if (HasExtension(filename, "exr")) {
                    if (c == 2)
                        // -1.5 is exactly representable as a float.
                        EXPECT_EQ(0, delta)
                            << "(" << x << ", " << y << ") c = " << c << " wrote "
                            << wrote << ", read " << rgb[c] << ", delta = " << delta;
                    else
                        EXPECT_LT(std::abs(delta), .001)
                            << filename << ":(" << x << ", " << y << ") c = " << c
                            << " wrote " << wrote << ", read " << rgb[c]
                            << ", delta = " << delta;
                } else {
                    // 8 bit format...
                    if (c == 2)
                        // -1.5 should be clamped to zero.
                        EXPECT_EQ(0, rgb[c])
                            << "(" << x << ", " << y << ") c = " << c << " wrote "
                            << wrote << ", read " << rgb[c] << " (expected 0 back)";
                    else
                        // Allow a fair amount of slop, since there's an sRGB
                        // conversion before quantization to 8-bits...
                        EXPECT_LT(std::abs(delta), .02)
                            << filename << ":(" << x << ", " << y << ") c = " << c
                            << " wrote " << wrote << ", read " << rgb[c]
                            << ", delta = " << delta;
                }
            }
        }

    // Clean up
    EXPECT_EQ(0, remove(filename.c_str()));
}